

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,size_t i)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  uint uVar65;
  float fVar66;
  vfloat4 a0;
  undefined1 auVar67 [32];
  vfloat4 b1;
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  
  pBVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar65 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                               super_CurveGeometry.super_Geometry.field_0x58 +
                    i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.field_0x68);
  uVar14 = (ulong)uVar65;
  pcVar2 = (pBVar1->super_RawBufferView).ptr_ofs;
  sVar3 = (pBVar1->super_RawBufferView).stride;
  lVar17 = sVar3 * uVar14;
  uVar19 = (ulong)(uVar65 + 1);
  lVar15 = sVar3 * uVar19;
  pBVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar4 = (pBVar1->super_RawBufferView).ptr_ofs;
  sVar3 = (pBVar1->super_RawBufferView).stride;
  lVar16 = sVar3 * uVar14;
  lVar18 = sVar3 * uVar19;
  fVar66 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           normals.items;
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar3 = (pBVar5->super_RawBufferView).stride;
  auVar40 = *(undefined1 (*) [16])(pcVar6 + sVar3 * uVar14);
  auVar39 = *(undefined1 (*) [16])(pcVar6 + sVar3 * uVar19);
  pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           dnormals.items;
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar3 = (pBVar5->super_RawBufferView).stride;
  auVar37 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar2 + lVar17),
                              ZEXT416((uint)(fVar66 * *(float *)(pcVar2 + lVar17 + 0xc))),0x30);
  auVar23 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar4 + lVar16),
                              ZEXT416((uint)(fVar66 * *(float *)(pcVar4 + lVar16 + 0xc))),0x30);
  auVar20 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar21 = vfnmadd213ps_avx512vl(auVar23,auVar20,auVar37);
  auVar23 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar4 + lVar18),
                              ZEXT416((uint)(fVar66 * *(float *)(pcVar4 + lVar18 + 0xc))),0x30);
  auVar38 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar2 + lVar15),
                              ZEXT416((uint)(fVar66 * *(float *)(pcVar2 + lVar15 + 0xc))),0x30);
  auVar22 = vfmadd213ps_avx512vl(auVar23,auVar20,auVar38);
  auVar69._0_12_ = ZEXT812(0);
  auVar69._12_4_ = 0;
  auVar23 = vmulps_avx512vl(auVar38,auVar69);
  auVar23 = vfmadd231ps_avx512vl(auVar23,auVar22,auVar69);
  auVar24 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar21,auVar23);
  auVar25 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(pcVar6 + uVar14 * sVar3),auVar40,auVar20);
  auVar26 = vfmadd132ps_avx512vl(auVar20,auVar39,*(undefined1 (*) [16])(pcVar6 + sVar3 * uVar19));
  auVar20 = vmulps_avx512vl(auVar39,auVar69);
  auVar27 = vfmadd231ps_avx512vl(auVar20,auVar26,auVar69);
  auVar20 = vfmadd213ps_avx512vl(ZEXT816(0),auVar25,auVar27);
  auVar28 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar31._0_4_ = auVar40._0_4_ + auVar20._0_4_;
  auVar31._4_4_ = auVar40._4_4_ + auVar20._4_4_;
  auVar31._8_4_ = auVar40._8_4_ + auVar20._8_4_;
  auVar31._12_4_ = auVar40._12_4_ + auVar20._12_4_;
  auVar23 = vfmadd231ps_avx512vl(auVar23,auVar21,auVar28);
  auVar29 = vfnmadd231ps_avx512vl(auVar23,auVar37,auVar28);
  auVar30 = vshufps_avx512vl(auVar29,auVar29,0xc9);
  auVar23 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar32._0_4_ = auVar23._0_4_ * auVar29._0_4_;
  auVar32._4_4_ = auVar23._4_4_ * auVar29._4_4_;
  auVar32._8_4_ = auVar23._8_4_ * auVar29._8_4_;
  auVar32._12_4_ = auVar23._12_4_ * auVar29._12_4_;
  auVar23 = vfmsub231ps_avx512vl(auVar32,auVar30,auVar31);
  auVar20 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar23 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar24 = vaddps_avx512vl(auVar37,auVar24);
  auVar31 = vshufps_avx512vl(auVar24,auVar24,0xff);
  uVar65 = auVar23._0_4_;
  auVar32 = vrsqrt14ss_avx512f(auVar69,ZEXT416(uVar65));
  auVar33 = vmulss_avx512f(auVar32,ZEXT416(0x3fc00000));
  auVar34 = vmulss_avx512f(auVar23,ZEXT416(0x3f000000));
  auVar34 = vmulss_avx512f(auVar34,auVar32);
  auVar32 = vmulss_avx512f(auVar32,auVar32);
  auVar32 = vmulss_avx512f(auVar34,auVar32);
  auVar32 = vsubss_avx512f(auVar33,auVar32);
  auVar32 = vbroadcastss_avx512vl(auVar32);
  auVar33 = vmulps_avx512vl(auVar20,auVar32);
  auVar34 = vmulps_avx512vl(auVar31,auVar33);
  auVar35 = vshufps_avx512vl(auVar29,auVar29,0xff);
  auVar33 = vmulps_avx512vl(auVar35,auVar33);
  auVar35 = vrcp14ss_avx512f(auVar69,ZEXT416(uVar65));
  auVar27 = vfmadd231ps_avx512vl(auVar27,auVar25,auVar28);
  auVar27 = vfnmadd231ps_avx512vl(auVar27,auVar40,auVar28);
  auVar36 = vshufps_avx512vl(auVar27,auVar27,0xc9);
  auVar36 = vmulps_avx512vl(auVar29,auVar36);
  auVar27 = vfmsub231ps_avx512vl(auVar36,auVar30,auVar27);
  auVar36._4_4_ = uVar65;
  auVar36._0_4_ = uVar65;
  auVar36._8_4_ = uVar65;
  auVar36._12_4_ = uVar65;
  auVar23 = vfnmadd213ss_avx512f(auVar23,auVar35,ZEXT416(0x40000000));
  auVar30 = vmulss_avx512f(auVar35,auVar23);
  auVar27 = vshufps_avx512vl(auVar27,auVar27,0xc9);
  auVar23 = vdpps_avx(auVar20,auVar27,0x7f);
  auVar27 = vmulps_avx512vl(auVar36,auVar27);
  auVar35._0_4_ = auVar34._0_4_ + auVar24._0_4_;
  auVar35._4_4_ = auVar34._4_4_ + auVar24._4_4_;
  auVar35._8_4_ = auVar34._8_4_ + auVar24._8_4_;
  auVar35._12_4_ = auVar34._12_4_ + auVar24._12_4_;
  fVar66 = auVar23._0_4_;
  auVar23._0_4_ = auVar20._0_4_ * fVar66;
  auVar23._4_4_ = auVar20._4_4_ * fVar66;
  auVar23._8_4_ = auVar20._8_4_ * fVar66;
  auVar23._12_4_ = auVar20._12_4_ * fVar66;
  auVar68._8_4_ = 2;
  auVar68._0_8_ = 0x200000002;
  auVar68._12_4_ = 2;
  auVar68._16_4_ = 2;
  auVar68._20_4_ = 2;
  auVar68._24_4_ = 2;
  auVar68._28_4_ = 2;
  auVar23 = vsubps_avx512vl(auVar27,auVar23);
  auVar41 = vpermps_avx512vl(auVar68,ZEXT1632(auVar35));
  auVar20 = vbroadcastss_avx512vl(auVar30);
  auVar27._0_4_ = auVar20._0_4_ * auVar23._0_4_;
  auVar27._4_4_ = auVar20._4_4_ * auVar23._4_4_;
  auVar27._8_4_ = auVar20._8_4_ * auVar23._8_4_;
  auVar27._12_4_ = auVar20._12_4_ * auVar23._12_4_;
  auVar23 = vmulps_avx512vl(auVar32,auVar27);
  auVar23 = vmulps_avx512vl(auVar31,auVar23);
  auVar27 = vaddps_avx512vl(auVar33,auVar23);
  auVar20._0_4_ = auVar29._0_4_ + auVar27._0_4_;
  auVar20._4_4_ = auVar29._4_4_ + auVar27._4_4_;
  auVar20._8_4_ = auVar29._8_4_ + auVar27._8_4_;
  auVar20._12_4_ = auVar29._12_4_ + auVar27._12_4_;
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar23 = vmulps_avx512vl(auVar20,auVar30);
  auVar31 = vaddps_avx512vl(auVar35,auVar23);
  auVar42 = vpermps_avx512vl(auVar68,ZEXT1632(auVar31));
  auVar44._16_16_ = auVar42._16_16_;
  auVar23 = vxorps_avx512vl(auVar32,auVar32);
  auVar23 = vfmadd213ps_avx512vl(auVar23,auVar22,auVar38);
  auVar23 = vfmadd231ps_avx512vl(auVar23,auVar21,auVar69);
  auVar32 = vfmadd231ps_avx512vl(auVar23,auVar37,auVar69);
  auVar23 = vmulps_avx512vl(auVar38,auVar28);
  auVar23 = vfnmadd231ps_avx512vl(auVar23,auVar28,auVar22);
  auVar20 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar26,auVar39);
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar25,auVar69);
  auVar20 = vfmadd231ps_fma(auVar20,auVar40,auVar69);
  auVar23 = vfmadd231ps_avx512vl(auVar23,auVar69,auVar21);
  auVar37 = vfnmadd231ps_avx512vl(auVar23,auVar69,auVar37);
  auVar38 = vshufps_avx512vl(auVar37,auVar37,0xc9);
  auVar23 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar23 = vmulps_avx512vl(auVar37,auVar23);
  auVar23 = vfmsub231ps_avx512vl(auVar23,auVar38,auVar20);
  auVar20 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar23 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar39 = vmulps_avx512vl(auVar39,auVar28);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar28,auVar26);
  auVar44._0_16_ = auVar69;
  auVar45._4_28_ = auVar44._4_28_;
  auVar45._0_4_ = auVar23._0_4_;
  auVar21 = vrsqrt14ss_avx512f(auVar69,auVar45._0_16_);
  auVar22 = vmulss_avx512f(auVar21,ZEXT416(0x3fc00000));
  auVar26 = vmulss_avx512f(auVar23,ZEXT416(0x3f000000));
  auVar26 = vmulss_avx512f(auVar26,auVar21);
  auVar21 = vmulss_avx512f(auVar21,auVar21);
  auVar21 = vmulss_avx512f(auVar26,auVar21);
  auVar26 = vshufps_avx512vl(auVar32,auVar32,0xff);
  auVar21 = vsubss_avx512f(auVar22,auVar21);
  auVar21 = vbroadcastss_avx512vl(auVar21);
  auVar22 = vmulps_avx512vl(auVar20,auVar21);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar69,auVar25);
  auVar25 = vmulps_avx512vl(auVar26,auVar22);
  auVar40 = vfnmadd231ps_avx512vl(auVar39,auVar69,auVar40);
  auVar39 = vshufps_avx512vl(auVar40,auVar40,0xc9);
  auVar39 = vmulps_avx512vl(auVar37,auVar39);
  auVar40 = vfmsub231ps_avx512vl(auVar39,auVar38,auVar40);
  auVar39 = vbroadcastss_avx512vl(auVar23);
  auVar40 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar39 = vmulps_avx512vl(auVar39,auVar40);
  auVar40 = vdpps_avx(auVar20,auVar40,0x7f);
  auVar38 = vshufps_avx512vl(auVar37,auVar37,0xff);
  auVar38 = vmulps_avx512vl(auVar38,auVar22);
  auVar22 = vaddps_avx512vl(auVar32,auVar25);
  fVar66 = auVar40._0_4_;
  auVar40._0_4_ = fVar66 * auVar20._0_4_;
  auVar40._4_4_ = fVar66 * auVar20._4_4_;
  auVar40._8_4_ = fVar66 * auVar20._8_4_;
  auVar40._12_4_ = fVar66 * auVar20._12_4_;
  auVar40 = vsubps_avx512vl(auVar39,auVar40);
  auVar39 = vrcp14ss_avx512f(auVar69,auVar45._0_16_);
  auVar23 = vfnmadd213ss_avx512f(auVar23,auVar39,ZEXT416(0x40000000));
  fVar66 = auVar23._0_4_ * auVar39._0_4_;
  auVar39._0_4_ = auVar40._0_4_ * fVar66;
  auVar39._4_4_ = auVar40._4_4_ * fVar66;
  auVar39._8_4_ = auVar40._8_4_ * fVar66;
  auVar39._12_4_ = auVar40._12_4_ * fVar66;
  auVar40 = vmulps_avx512vl(auVar21,auVar39);
  auVar40 = vmulps_avx512vl(auVar26,auVar40);
  auVar23 = vaddps_avx512vl(auVar38,auVar40);
  auVar40 = vaddps_avx512vl(auVar37,auVar23);
  auVar40 = vmulps_avx512vl(auVar40,auVar30);
  auVar40 = vsubps_avx(auVar22,auVar40);
  auVar47 = vpermps_avx2(auVar68,ZEXT1632(auVar40));
  auVar49 = vpermps_avx2(auVar68,ZEXT1632(auVar22));
  auVar43 = vmulps_avx512vl(auVar49,bezier_basis0._3944_32_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._2788_32_,auVar47);
  auVar43 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._1632_32_,auVar42);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar45 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._476_32_,auVar41);
  auVar46 = vmaxps_avx512vl(auVar44,auVar45);
  fVar66 = bezier_basis0._8568_4_;
  fVar7 = bezier_basis0._8572_4_;
  auVar43._4_4_ = auVar49._4_4_ * fVar7;
  auVar43._0_4_ = auVar49._0_4_ * fVar66;
  fVar8 = bezier_basis0._8576_4_;
  auVar43._8_4_ = auVar49._8_4_ * fVar8;
  fVar9 = bezier_basis0._8580_4_;
  auVar43._12_4_ = auVar49._12_4_ * fVar9;
  fVar10 = bezier_basis0._8584_4_;
  auVar43._16_4_ = auVar49._16_4_ * fVar10;
  fVar11 = bezier_basis0._8588_4_;
  auVar43._20_4_ = auVar49._20_4_ * fVar11;
  fVar12 = bezier_basis0._8592_4_;
  auVar43._24_4_ = auVar49._24_4_ * fVar12;
  auVar43._28_4_ = auVar49._28_4_;
  auVar39 = vfmadd231ps_fma(auVar43,bezier_basis0._7412_32_,auVar47);
  auVar47 = vfmadd231ps_avx512vl(ZEXT1632(auVar39),bezier_basis0._6256_32_,auVar42);
  auVar42._8_8_ = bezier_basis0._5108_8_;
  auVar42._0_8_ = bezier_basis0._5100_8_;
  auVar42._16_8_ = bezier_basis0._5116_8_;
  auVar42._24_8_ = bezier_basis0._5124_8_;
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar42,auVar41);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar49 = vmulps_avx512vl(auVar47,auVar48);
  auVar47 = vblendps_avx(auVar49,ZEXT432(0) << 0x20,1);
  auVar43 = vsubps_avx512vl(auVar45,auVar47);
  auVar47 = vblendps_avx(auVar49,ZEXT432(0) << 0x20,0x80);
  auVar41 = vaddps_avx512vl(auVar45,auVar47);
  auVar47 = vmaxps_avx512vl(auVar43,auVar41);
  auVar50 = vmaxps_avx512vl(auVar46,auVar47);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar47 = vpermps_avx512vl(auVar46,ZEXT1632(auVar40));
  auVar49 = vpermps_avx512vl(auVar46,ZEXT1632(auVar22));
  auVar51 = vmulps_avx512vl(auVar49,bezier_basis0._3944_32_);
  auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._2788_32_,auVar47);
  auVar49 = vmulps_avx512vl(auVar49,bezier_basis0._8568_32_);
  auVar39 = vfmadd231ps_fma(auVar49,bezier_basis0._7412_32_,auVar47);
  auVar53._0_4_ = auVar40._0_4_;
  auVar53._4_4_ = auVar53._0_4_;
  auVar53._8_4_ = auVar53._0_4_;
  auVar53._12_4_ = auVar53._0_4_;
  auVar53._16_4_ = auVar53._0_4_;
  auVar53._20_4_ = auVar53._0_4_;
  auVar53._24_4_ = auVar53._0_4_;
  auVar53._28_4_ = auVar53._0_4_;
  auVar54._0_4_ = auVar22._0_4_;
  auVar54._4_4_ = auVar54._0_4_;
  auVar54._8_4_ = auVar54._0_4_;
  auVar54._12_4_ = auVar54._0_4_;
  auVar54._16_4_ = auVar54._0_4_;
  auVar54._20_4_ = auVar54._0_4_;
  auVar54._24_4_ = auVar54._0_4_;
  auVar54._28_4_ = auVar54._0_4_;
  auVar47 = vmulps_avx512vl(auVar54,bezier_basis0._3944_32_);
  auVar52 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._2788_32_,auVar53);
  auVar47 = vmulps_avx512vl(auVar54,bezier_basis0._8568_32_);
  auVar53 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._7412_32_,auVar53);
  auVar20 = vsubps_avx512vl(auVar32,auVar25);
  auVar40 = vsubps_avx512vl(auVar37,auVar23);
  auVar40 = vmulps_avx512vl(auVar40,auVar30);
  auVar40 = vsubps_avx(auVar20,auVar40);
  auVar47 = vpermps_avx2(auVar68,ZEXT1632(auVar40));
  auVar49 = vpermps_avx512vl(auVar68,ZEXT1632(auVar20));
  auVar54 = vmulps_avx512vl(auVar49,bezier_basis0._3944_32_);
  auVar54 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._2788_32_,auVar47);
  auVar49 = vmulps_avx512vl(auVar49,bezier_basis0._8568_32_);
  auVar55 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._7412_32_,auVar47);
  auVar49 = vpermps_avx512vl(auVar46,ZEXT1632(auVar40));
  auVar56 = vpermps_avx512vl(auVar46,ZEXT1632(auVar20));
  auVar47 = vmulps_avx512vl(auVar56,bezier_basis0._3944_32_);
  auVar57 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._2788_32_,auVar49);
  auVar47._4_4_ = auVar56._4_4_ * fVar7;
  auVar47._0_4_ = auVar56._0_4_ * fVar66;
  auVar47._8_4_ = auVar56._8_4_ * fVar8;
  auVar47._12_4_ = auVar56._12_4_ * fVar9;
  auVar47._16_4_ = auVar56._16_4_ * fVar10;
  auVar47._20_4_ = auVar56._20_4_ * fVar11;
  auVar47._24_4_ = auVar56._24_4_ * fVar12;
  auVar47._28_4_ = auVar56._28_4_;
  auVar56 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._7412_32_,auVar49);
  auVar61._0_4_ = auVar40._0_4_;
  auVar61._4_4_ = auVar61._0_4_;
  auVar61._8_4_ = auVar61._0_4_;
  auVar61._12_4_ = auVar61._0_4_;
  auVar61._16_4_ = auVar61._0_4_;
  auVar61._20_4_ = auVar61._0_4_;
  auVar61._24_4_ = auVar61._0_4_;
  auVar61._28_4_ = auVar61._0_4_;
  auVar59._0_4_ = auVar20._0_4_;
  auVar59._4_4_ = auVar59._0_4_;
  auVar59._8_4_ = auVar59._0_4_;
  auVar59._12_4_ = auVar59._0_4_;
  auVar59._16_4_ = auVar59._0_4_;
  auVar59._20_4_ = auVar59._0_4_;
  auVar59._24_4_ = auVar59._0_4_;
  auVar59._28_4_ = auVar59._0_4_;
  auVar47 = vmulps_avx512vl(auVar59,bezier_basis0._3944_32_);
  auVar58 = vfmadd231ps_avx512vl(auVar47,auVar61,bezier_basis0._2788_32_);
  auVar49._4_4_ = auVar59._0_4_ * fVar7;
  auVar49._0_4_ = auVar59._0_4_ * fVar66;
  auVar49._8_4_ = auVar59._0_4_ * fVar8;
  auVar49._12_4_ = auVar59._0_4_ * fVar9;
  auVar49._16_4_ = auVar59._0_4_ * fVar10;
  auVar49._20_4_ = auVar59._0_4_ * fVar11;
  auVar49._24_4_ = auVar59._0_4_ * fVar12;
  auVar49._28_4_ = bezier_basis0._8596_4_;
  auVar23 = vfmadd231ps_fma(auVar49,bezier_basis0._7412_32_,auVar61);
  auVar47 = vpermps_avx512vl(auVar46,ZEXT1632(auVar35));
  auVar49 = vpermps_avx512vl(auVar46,ZEXT1632(auVar31));
  auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._1632_32_,auVar49);
  auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._476_32_,auVar47);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar39),bezier_basis0._6256_32_,auVar49);
  auVar49 = vmaxps_avx512vl(auVar44,auVar51);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar42,auVar47);
  auVar59 = vmulps_avx512vl(ZEXT1632(auVar40),auVar48);
  auVar63 = ZEXT432(0) << 0x20;
  auVar47 = vblendps_avx(auVar59,auVar63,1);
  auVar60 = vsubps_avx512vl(auVar51,auVar47);
  auVar47 = vblendps_avx(auVar59,auVar63,0x80);
  auVar59 = vaddps_avx512vl(auVar51,auVar47);
  auVar47 = vmaxps_avx(auVar60,auVar59);
  auVar49 = vmaxps_avx(auVar49,auVar47);
  auVar62._4_4_ = auVar35._0_4_;
  auVar62._0_4_ = auVar35._0_4_;
  auVar62._8_4_ = auVar35._0_4_;
  auVar62._12_4_ = auVar35._0_4_;
  auVar62._16_4_ = auVar35._0_4_;
  auVar62._20_4_ = auVar35._0_4_;
  auVar62._24_4_ = auVar35._0_4_;
  auVar62._28_4_ = auVar35._0_4_;
  auVar47 = vbroadcastss_avx512vl(auVar31);
  auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._1632_32_,auVar47);
  auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._476_32_,auVar62);
  auVar47 = vfmadd231ps_avx512vl(auVar53,bezier_basis0._6256_32_,auVar47);
  auVar53 = vmaxps_avx512vl(auVar44,auVar52);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar42,auVar62);
  auVar61 = vmulps_avx512vl(auVar47,auVar48);
  auVar47 = vblendps_avx(auVar61,auVar63,1);
  auVar62 = vsubps_avx512vl(auVar52,auVar47);
  auVar47 = vblendps_avx(auVar61,auVar63,0x80);
  auVar61 = vaddps_avx512vl(auVar52,auVar47);
  auVar47 = vmaxps_avx512vl(auVar62,auVar61);
  auVar53 = vmaxps_avx512vl(auVar53,auVar47);
  auVar47 = vminps_avx512vl(auVar43,auVar41);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar43 = vminps_avx512vl(auVar63,auVar45);
  auVar64 = vminps_avx512vl(auVar43,auVar47);
  auVar47 = vminps_avx(auVar60,auVar59);
  auVar43 = vminps_avx512vl(auVar63,auVar51);
  auVar41 = vminps_avx(auVar43,auVar47);
  auVar47 = vminps_avx(auVar62,auVar61);
  auVar43 = vminps_avx512vl(auVar63,auVar52);
  auVar45 = vminps_avx(auVar43,auVar47);
  auVar40 = vsubps_avx(auVar24,auVar34);
  auVar39 = vsubps_avx(auVar29,auVar27);
  auVar39 = vmulps_avx512vl(auVar39,auVar30);
  auVar60._0_4_ = auVar40._0_4_;
  auVar67._0_4_ = auVar60._0_4_ + auVar39._0_4_;
  auVar59 = ZEXT1632(CONCAT412(auVar40._12_4_ + auVar39._12_4_,
                               CONCAT48(auVar40._8_4_ + auVar39._8_4_,
                                        CONCAT44(auVar40._4_4_ + auVar39._4_4_,auVar67._0_4_))));
  auVar47 = vpermps_avx2(auVar68,auVar59);
  auVar43 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._1632_32_,auVar47);
  auVar51 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._6256_32_,auVar47);
  auVar47 = vpermps_avx2(auVar68,ZEXT1632(auVar40));
  auVar52 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._476_32_,auVar47);
  auVar47 = vfmadd231ps_avx512vl(auVar51,auVar42,auVar47);
  auVar43 = vpermps_avx512vl(auVar46,auVar59);
  auVar51 = vfmadd231ps_avx512vl(auVar57,bezier_basis0._1632_32_,auVar43);
  auVar39 = vfmadd231ps_fma(auVar56,bezier_basis0._6256_32_,auVar43);
  auVar67._4_4_ = auVar67._0_4_;
  auVar67._8_4_ = auVar67._0_4_;
  auVar67._12_4_ = auVar67._0_4_;
  auVar67._16_4_ = auVar67._0_4_;
  auVar67._20_4_ = auVar67._0_4_;
  auVar67._24_4_ = auVar67._0_4_;
  auVar67._28_4_ = auVar67._0_4_;
  auVar54 = vfmadd231ps_avx512vl(auVar58,auVar67,bezier_basis0._1632_32_);
  auVar43 = vmaxps_avx512vl(auVar44,auVar52);
  auVar55 = vmulps_avx512vl(auVar47,auVar48);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),bezier_basis0._6256_32_,auVar67);
  auVar59 = ZEXT432(0) << 0x20;
  auVar47 = vblendps_avx(auVar55,auVar59,1);
  auVar56 = vsubps_avx512vl(auVar52,auVar47);
  auVar47 = vblendps_avx(auVar55,auVar59,0x80);
  auVar55 = vaddps_avx512vl(auVar52,auVar47);
  auVar47 = vmaxps_avx(auVar56,auVar55);
  auVar43 = vmaxps_avx(auVar43,auVar47);
  auVar47 = vpermps_avx512vl(auVar46,ZEXT1632(auVar40));
  auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._476_32_,auVar47);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar42,auVar47);
  auVar60._4_4_ = auVar60._0_4_;
  auVar60._8_4_ = auVar60._0_4_;
  auVar60._12_4_ = auVar60._0_4_;
  auVar60._16_4_ = auVar60._0_4_;
  auVar60._20_4_ = auVar60._0_4_;
  auVar60._24_4_ = auVar60._0_4_;
  auVar60._28_4_ = auVar60._0_4_;
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar60,bezier_basis0._476_32_);
  auVar46 = vmaxps_avx512vl(auVar44,auVar51);
  auVar57 = vmulps_avx512vl(ZEXT1632(auVar40),auVar48);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar42,auVar60);
  auVar47 = vblendps_avx(auVar57,auVar59,1);
  auVar58 = vsubps_avx512vl(auVar51,auVar47);
  auVar47 = vblendps_avx(auVar57,auVar59,0x80);
  auVar57 = vaddps_avx512vl(auVar51,auVar47);
  auVar47 = vmaxps_avx(auVar58,auVar57);
  auVar42 = vmaxps_avx(auVar46,auVar47);
  auVar44 = vmaxps_avx512vl(auVar44,auVar54);
  auVar46 = vmulps_avx512vl(ZEXT1632(auVar40),auVar48);
  auVar47 = vblendps_avx(auVar46,auVar59,1);
  auVar48 = vsubps_avx512vl(auVar54,auVar47);
  auVar47 = vblendps_avx(auVar46,auVar59,0x80);
  auVar59 = vaddps_avx512vl(auVar54,auVar47);
  auVar47 = vmaxps_avx(auVar48,auVar59);
  auVar47 = vmaxps_avx(auVar44,auVar47);
  auVar44 = vminps_avx(auVar56,auVar55);
  auVar46 = vminps_avx512vl(auVar63,auVar52);
  auVar44 = vminps_avx(auVar46,auVar44);
  auVar46 = vminps_avx(auVar58,auVar57);
  auVar51 = vminps_avx512vl(auVar63,auVar51);
  auVar46 = vminps_avx(auVar51,auVar46);
  auVar51 = vminps_avx512vl(auVar63,auVar54);
  auVar48 = vminps_avx(auVar48,auVar59);
  auVar48 = vminps_avx(auVar51,auVar48);
  auVar51 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vmaxps_avx(auVar47,auVar51);
  auVar51 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar51);
  auVar40 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar47 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar47 = vmaxps_avx(auVar42,auVar47);
  auVar42 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar42);
  auVar39 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar39 = vunpcklps_avx(auVar40,auVar39);
  auVar47 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar47 = vmaxps_avx(auVar43,auVar47);
  auVar43 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar43);
  auVar40 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar40 = vinsertps_avx(auVar39,auVar40,0x28);
  auVar47 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar47 = vminps_avx(auVar48,auVar47);
  auVar43 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar43);
  auVar39 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar47 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar47 = vminps_avx(auVar46,auVar47);
  auVar43 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar43);
  auVar23 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar23 = vunpcklps_avx(auVar39,auVar23);
  auVar47 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar47 = vminps_avx(auVar44,auVar47);
  auVar43 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar43);
  auVar39 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar39 = vinsertps_avx(auVar23,auVar39,0x28);
  auVar47 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar47 = vminps_avx(auVar45,auVar47);
  auVar43 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar43);
  auVar23 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar47 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar47 = vminps_avx(auVar41,auVar47);
  auVar43 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar43);
  auVar20 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar20 = vunpcklps_avx(auVar23,auVar20);
  auVar47 = vshufps_avx(auVar64,auVar64,0xb1);
  auVar47 = vminps_avx(auVar64,auVar47);
  auVar43 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar43);
  auVar23 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar23 = vinsertps_avx(auVar20,auVar23,0x28);
  auVar20 = vminps_avx(auVar39,auVar23);
  auVar47 = vshufps_avx512vl(auVar53,auVar53,0xb1);
  auVar43 = vmaxps_avx512vl(auVar53,auVar47);
  auVar47 = vshufpd_avx(auVar43,auVar43,5);
  auVar47 = vmaxps_avx(auVar43,auVar47);
  auVar39 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar47 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar47 = vmaxps_avx(auVar49,auVar47);
  auVar49 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar49);
  auVar23 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar23 = vunpcklps_avx(auVar39,auVar23);
  auVar47 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar47 = vmaxps_avx(auVar50,auVar47);
  auVar49 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar49);
  auVar39 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar39 = vinsertps_avx(auVar23,auVar39,0x28);
  auVar23 = vmaxps_avx(auVar40,auVar39);
  auVar37._8_4_ = 0x7fffffff;
  auVar37._0_8_ = 0x7fffffff7fffffff;
  auVar37._12_4_ = 0x7fffffff;
  auVar40 = vandps_avx(auVar20,auVar37);
  auVar39 = vandps_avx(auVar23,auVar37);
  auVar40 = vmaxps_avx(auVar40,auVar39);
  auVar39 = vmovshdup_avx(auVar40);
  auVar39 = vmaxss_avx(auVar39,auVar40);
  auVar40 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vmaxss_avx(auVar40,auVar39);
  fVar66 = auVar40._0_4_ * 4.7683716e-07;
  auVar38._4_4_ = fVar66;
  auVar38._0_4_ = fVar66;
  auVar38._8_4_ = fVar66;
  auVar38._12_4_ = fVar66;
  aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar20,auVar38);
  (__return_storage_ptr__->lower).field_0 = aVar13;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar23._0_4_ + fVar66;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar23._4_4_ + fVar66;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar23._8_4_ + fVar66;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar23._12_4_ + fVar66;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }